

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_region_assign(TCGContext_conflict9 *s,size_t curr_region)

{
  void *local_28;
  void *end;
  void *start;
  size_t curr_region_local;
  TCGContext_conflict9 *s_local;
  
  start = (void *)curr_region;
  curr_region_local = (size_t)s;
  tcg_region_bounds(s,curr_region,&end,&local_28);
  *(void **)(curr_region_local + 0xa0) = end;
  *(void **)(curr_region_local + 0xc0) = end;
  *(long *)(curr_region_local + 0xb8) = (long)local_28 - (long)end;
  memset(*(void **)(curr_region_local + 0xa0),0,*(size_t *)(curr_region_local + 0xb8));
  *(long *)(curr_region_local + 0xd0) = (long)local_28 + -0x400;
  return;
}

Assistant:

static void tcg_region_assign(TCGContext *s, size_t curr_region)
{
    void *start, *end;

    tcg_region_bounds(s, curr_region, &start, &end);

    s->code_gen_buffer = start;
    s->code_gen_ptr = start;
    s->code_gen_buffer_size = (char *)end - (char *)start;

    memset(s->code_gen_buffer, 0x00, s->code_gen_buffer_size);
    s->code_gen_highwater = (char *)end - TCG_HIGHWATER;
}